

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint64_t fletcher2(char *key,int len,uint64_t seed)

{
  uint64_t uVar1;
  byte *pbVar2;
  uint64_t *dataw;
  
  uVar1 = 0;
  for (pbVar2 = (byte *)key; pbVar2 < key + (long)(len / 8) * 8; pbVar2 = pbVar2 + 8) {
    seed = seed + *(long *)pbVar2;
    uVar1 = uVar1 + seed;
  }
  if ((len & 7U) != 0) {
    for (; pbVar2 < key + len; pbVar2 = pbVar2 + 1) {
      seed = seed + *pbVar2;
      uVar1 = uVar1 + seed;
    }
  }
  return uVar1;
}

Assistant:

uint64_t
fletcher2(const char *key, int len, uint64_t seed)
{
  uint64_t *dataw = (uint64_t *)key;
  const uint64_t *const endw = &((const uint64_t*)key)[len/8];
  uint64_t A = seed, B = 0;
  for (; dataw < endw; dataw++) {
    A += *dataw;
    B += A;
  }
  if (len & 7) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    for (; datac < endc; datac++) {
      A += *datac;
      B += A;
    }
  }
  return B;
}